

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true> __thiscall
duckdb::DataTable::InitializeUpdate
          (DataTable *this,TableCatalogEntry *table,ClientContext *context,
          vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
          *bound_constraints)

{
  DataTableInfo *this_00;
  tuple<duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_> __p_00;
  __uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_> *this_01;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
  *in_R8;
  pointer __p;
  __uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_> local_28;
  
  this_00 = shared_ptr<duckdb::DataTableInfo,_true>::operator->
                      ((shared_ptr<duckdb::DataTableInfo,_true> *)
                       &(table->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.set);
  DataTableInfo::InitializeIndexes(this_00,(ClientContext *)bound_constraints,(char *)0x0);
  make_uniq<duckdb::TableUpdateState>();
  __p_00.
  super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>)
       operator_new(0x10);
  *(ClientContext **)
   __p_00.
   super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
   super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl = context;
  *(vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
    **)((long)__p_00.
              super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
              .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl + 8) = in_R8;
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (tuple<duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>)
       (tuple<duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>)
       __p_00.
       super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
       .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl;
  this_01 = (__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
             *)unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
               ::operator->((unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>,_true>
                             *)this);
  local_28._M_t.
  super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>.
  super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl =
       (tuple<duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>)
       (_Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>)
       0x0;
  ::std::__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
  reset(this_01,(pointer)__p_00.
                         super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
                         .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
  ~unique_ptr((unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_> *)
              &local_28);
  return (unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>)
         (unique_ptr<duckdb::TableUpdateState,_std::default_delete<duckdb::TableUpdateState>_>)this;
}

Assistant:

unique_ptr<TableUpdateState> DataTable::InitializeUpdate(TableCatalogEntry &table, ClientContext &context,
                                                         const vector<unique_ptr<BoundConstraint>> &bound_constraints) {
	// check that there are no unknown indexes
	info->InitializeIndexes(context);

	auto result = make_uniq<TableUpdateState>();
	result->constraint_state = InitializeConstraintState(table, bound_constraints);
	return result;
}